

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindStates(lemon *lemp)

{
  char *key;
  int iVar1;
  symbol *psVar2;
  config *pcVar3;
  long lVar4;
  rule *prVar5;
  
  current = (config *)0x0;
  currentend = &current;
  basis = (config *)0x0;
  basisend = &basis;
  Configtable_init();
  key = lemp->start;
  if (key != (char *)0x0) {
    psVar2 = Symbol_find(key);
    if (psVar2 != (symbol *)0x0) goto LAB_00104180;
    ErrorMsg(lemp->filename,0,
             "The specified start symbol \"%s\" is not in a nonterminal of the grammar.  \"%s\" will be used as the start symbol instead."
             ,key,lemp->startRule->lhs->name);
    lemp->errorcnt = lemp->errorcnt + 1;
  }
  psVar2 = lemp->startRule->lhs;
LAB_00104180:
  for (prVar5 = lemp->rule; prVar5 != (rule *)0x0; prVar5 = prVar5->next) {
    iVar1 = prVar5->nrhs;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        if (prVar5->rhs[lVar4] == psVar2) {
          ErrorMsg(lemp->filename,0,
                   "The start symbol \"%s\" occurs on the right-hand side of a rule. This will result in a parser which does not work properly."
                   ,psVar2->name);
          lemp->errorcnt = lemp->errorcnt + 1;
          iVar1 = prVar5->nrhs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar1);
    }
  }
  prVar5 = psVar2->rule;
  while( true ) {
    if (prVar5 == (rule *)0x0) {
      getstate(lemp);
      return;
    }
    prVar5->lhsStart = 1;
    pcVar3 = Configlist_addbasis(prVar5,0);
    if (size < 1) break;
    *pcVar3->fws = '\x01';
    prVar5 = prVar5->nextlhs;
  }
  __assert_fail("e>=0 && e<size",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                ,0x1247,"int SetAdd(char *, int)");
}

Assistant:

void FindStates(struct lemon *lemp)
{
  struct symbol *sp;
  struct rule *rp;

  Configlist_init();

  /* Find the start symbol */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      ErrorMsg(lemp->filename,0,
"The specified start symbol \"%s\" is not \
in a nonterminal of the grammar.  \"%s\" will be used as the start \
symbol instead.",lemp->start,lemp->startRule->lhs->name);
      lemp->errorcnt++;
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }

  /* Make sure the start symbol doesn't occur on the right-hand side of
  ** any rule.  Report an error if it does.  (YACC would generate a new
  ** start symbol in this case.) */
  for(rp=lemp->rule; rp; rp=rp->next){
    int i;
    for(i=0; i<rp->nrhs; i++){
      if( rp->rhs[i]==sp ){   /* FIX ME:  Deal with multiterminals */
        ErrorMsg(lemp->filename,0,
"The start symbol \"%s\" occurs on the \
right-hand side of a rule. This will result in a parser which \
does not work properly.",sp->name);
        lemp->errorcnt++;
      }
    }
  }

  /* The basis configuration set for the first state
  ** is all rules which have the start symbol as their
  ** left-hand side */
  for(rp=sp->rule; rp; rp=rp->nextlhs){
    struct config *newcfp;
    rp->lhsStart = 1;
    newcfp = Configlist_addbasis(rp,0);
    SetAdd(newcfp->fws,0);
  }

  /* Compute the first state.  All other states will be
  ** computed automatically during the computation of the first one.
  ** The returned pointer to the first state is not used. */
  (void)getstate(lemp);
  return;
}